

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int imcomp_nullscalei2(short *idata,long tilelen,short nullflagval,short nullval,double scale,
                      double zero,int *status)

{
  double dVar1;
  double dvalue;
  long ii;
  int *status_local;
  double zero_local;
  double scale_local;
  short nullval_local;
  short nullflagval_local;
  long tilelen_local;
  short *idata_local;
  
  for (ii = 0; ii < tilelen; ii = ii + 1) {
    if (idata[ii] == nullflagval) {
      idata[ii] = nullval;
    }
    else {
      dVar1 = ((double)(int)idata[ii] - zero) / scale;
      if (-32768.49 <= dVar1) {
        if (dVar1 <= 32767.49) {
          if (dVar1 < 0.0) {
            idata[ii] = (short)(int)(dVar1 - 0.5);
          }
          else {
            idata[ii] = (short)(int)(dVar1 + 0.5);
          }
        }
        else {
          *status = -0xb;
          idata[ii] = 0x7fff;
        }
      }
      else {
        *status = -0xb;
        idata[ii] = -0x8000;
      }
    }
  }
  return *status;
}

Assistant:

int imcomp_nullscalei2(
     short *idata, 
     long tilelen,
     short nullflagval,
     short nullval,
     double scale,
     double zero,
     int *status)
/*
   do null value substitution AND scaling of the integer array.
   If array value = nullflagval, then set the value to nullval.
   Otherwise, inverse scale the integer value.
*/
{
    long ii;
    double dvalue;
    
    for (ii=0; ii < tilelen; ii++)
    {
        if (idata[ii] == nullflagval)
	    idata[ii] = nullval;
	else 
	{
            dvalue = (idata[ii] - zero) / scale;

            if (dvalue < DSHRT_MIN)
            {
                *status = OVERFLOW_ERR;
                idata[ii] = SHRT_MIN;
            }
            else if (dvalue > DSHRT_MAX)
            {
                *status = OVERFLOW_ERR;
                idata[ii] = SHRT_MAX;
            }
            else
            {
                if (dvalue >= 0)
                    idata[ii] = (int) (dvalue + .5);
                else
                    idata[ii] = (int) (dvalue - .5);
            }
        }
    }
    return(*status);
}